

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

int64_t __thiscall spvtools::opt::analysis::Constant::GetSignExtendedValue(Constant *this)

{
  int iVar1;
  uint32_t uVar2;
  int32_t iVar3;
  Type *pTVar4;
  undefined4 extraout_var;
  IntConstant *this_00;
  undefined4 extraout_var_01;
  IntConstant *ic;
  int64_t value;
  uint32_t width;
  Integer *int_type;
  Constant *this_local;
  undefined4 extraout_var_00;
  
  pTVar4 = type(this);
  iVar1 = (*pTVar4->_vptr_Type[10])();
  if ((Integer *)CONCAT44(extraout_var,iVar1) == (Integer *)0x0) {
    __assert_fail("int_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                  ,0x7e,"int64_t spvtools::opt::analysis::Constant::GetSignExtendedValue() const");
  }
  uVar2 = Integer::width((Integer *)CONCAT44(extraout_var,iVar1));
  if (uVar2 < 0x41) {
    ic = (IntConstant *)0x0;
    iVar1 = (*this->_vptr_Constant[0xe])();
    this_00 = (IntConstant *)CONCAT44(extraout_var_00,iVar1);
    if (this_00 == (IntConstant *)0x0) {
      iVar1 = (*this->_vptr_Constant[0x16])();
      if (CONCAT44(extraout_var_01,iVar1) == 0) {
        __assert_fail("AsNullConstant() && \"Must be an integer constant.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                      ,0x8b,
                      "int64_t spvtools::opt::analysis::Constant::GetSignExtendedValue() const");
      }
    }
    else if (uVar2 < 0x21) {
      iVar3 = IntConstant::GetS32BitValue(this_00);
      ic = (IntConstant *)(long)iVar3;
    }
    else {
      ic = (IntConstant *)IntConstant::GetS64BitValue(this_00);
    }
    return (int64_t)ic;
  }
  __assert_fail("width <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,0x80,"int64_t spvtools::opt::analysis::Constant::GetSignExtendedValue() const");
}

Assistant:

int64_t Constant::GetSignExtendedValue() const {
  const auto* int_type = type()->AsInteger();
  assert(int_type != nullptr);
  const auto width = int_type->width();
  assert(width <= 64);

  int64_t value = 0;
  if (const IntConstant* ic = AsIntConstant()) {
    if (width <= 32) {
      // Let the C++ compiler do the sign extension.
      value = int64_t(ic->GetS32BitValue());
    } else {
      value = ic->GetS64BitValue();
    }
  } else {
    assert(AsNullConstant() && "Must be an integer constant.");
  }
  return value;
}